

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial.c
# Opt level: O3

void solv_partial(Item *qsol,Symbol *fun)

{
  Symbol *n;
  long lVar1;
  char *in_RCX;
  List *pLVar2;
  uint uVar3;
  ulong uVar4;
  
  n = lookup("delta_x");
  if (n == (Symbol *)0x0) {
    n = install("delta_x",0x13e);
    parminstall(n,"1","",in_RCX);
  }
  sprintf(buf,"%s();\n",fun->name);
  replacstr(qsol,buf);
  save_dt(partialcolon);
  pLVar2 = parinfo->next;
  if (pLVar2 != parinfo) {
    lVar1 = 0;
    do {
      do {
        *(anon_union_8_4_46e41722_for_element *)(pv + lVar1) = pLVar2->element;
        pLVar2 = pLVar2->next;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
      partialcolon = (pLVar2->element).itm;
      uVar3 = (uint)pLVar2->itemtype;
      uVar4 = (ulong)uVar3;
      sprintf(buf,
              "if (error=crank(%d, %s, %s, %s, delta_%s, %s, %s, _pbound%d, &_parwork%d))return error;\n"
              ,(ulong)(uint)pv[2]->araydim,pv[2]->name,pv[1]->name,pv[3]->name,indepsym->name,
              n->name,indepsym->name,uVar4,uVar4);
      replacstr(partialcolon,buf);
      sprintf(buf,"static double *_pbound%d[4], _bnd%d_0, _bnd%d_N, *_parwork%d;\n",uVar4,
              (ulong)uVar3,uVar4,(ulong)uVar3);
      linsertstr(procfunc,buf);
      pLVar2 = pLVar2->next;
      lVar1 = 0;
    } while (pLVar2 != parinfo);
  }
  return;
}

Assistant:

void solv_partial(qsol, fun)
	Item *qsol;
	Symbol *fun;
{
	int i, ident;
	Item *q;
	Symbol *dspace;
	
	if ((dspace = lookup("delta_x")) == SYM0) {
		dspace = install("delta_x", NAME);
		parminstall(dspace, "1", "");
	}
	Sprintf(buf, "%s();\n", fun->name);
	replacstr(qsol, buf);
	save_dt(partialcolon);
   ITERATE(q, parinfo) {
	for (i=0; i<4; i++) {
		pv[i] = SYM(q);
		q = q->next;
	}
	partialcolon = ITM(q);
	ident = q->itemtype;
	
Sprintf(buf, "if (error=crank(%d, %s, %s, %s, delta_%s, %s, %s, _pbound%d, &_parwork%d))return error;\n",
	pv[2]->araydim, pv[2]->name, pv[1]->name, pv[3]->name,
	indepsym->name, dspace->name, indepsym->name, ident, ident);
	replacstr(partialcolon, buf);
	Sprintf(buf, "static double *_pbound%d[4], _bnd%d_0, _bnd%d_N, *_parwork%d;\n",
		ident, ident, ident, ident);
	Linsertstr(procfunc, buf);
   }
}